

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.h
# Opt level: O3

uint8_t * __thiscall
google::protobuf::internal::ImplicitWeakMessage::_InternalSerialize
          (ImplicitWeakMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint size;
  string *psVar1;
  pointer data;
  uint8_t *puVar2;
  
  psVar1 = this->data_;
  if (psVar1 != (string *)0x0) {
    data = (psVar1->_M_dataplus)._M_p;
    size = (uint)psVar1->_M_string_length;
    if ((long)stream->end_ - (long)target < (long)(int)size) {
      puVar2 = io::EpsCopyOutputStream::WriteRawFallback(stream,data,size,target);
      return puVar2;
    }
    memcpy(target,data,(ulong)size);
    target = target + (int)size;
  }
  return target;
}

Assistant:

uint8_t* _InternalSerialize(
      uint8_t* target, io::EpsCopyOutputStream* stream) const PROTOBUF_FINAL {
    if (data_ == nullptr) {
      return target;
    }
    return stream->WriteRaw(data_->data(), static_cast<int>(data_->size()),
                            target);
  }